

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t COVER_checkTotalCompressedSize
                 (ZDICT_cover_params_t parameters,size_t *samplesSizes,BYTE *samples,size_t *offsets
                 ,size_t nbTrainSamples,size_t nbSamples,BYTE *dict,size_t dictBufferCapacity)

{
  size_t sVar1;
  void *dst;
  ZSTD_CCtx *cctx;
  ZSTD_CDict *cdict;
  size_t sVar2;
  ulong uVar3;
  
  sVar1 = 0;
  uVar3 = nbTrainSamples;
  if (1.0 <= parameters.splitPoint) {
    nbTrainSamples = sVar1;
    uVar3 = sVar1;
  }
  for (; nbTrainSamples < nbSamples; nbTrainSamples = nbTrainSamples + 1) {
    if (sVar1 < samplesSizes[nbTrainSamples]) {
      sVar1 = samplesSizes[nbTrainSamples];
    }
  }
  sVar1 = ZSTD_compressBound(sVar1);
  dst = malloc(sVar1);
  cctx = ZSTD_createCCtx();
  cdict = ZSTD_createCDict(dict,dictBufferCapacity,parameters.zParams.compressionLevel);
  if (cdict == (ZSTD_CDict *)0x0 || (cctx == (ZSTD_CCtx *)0x0 || dst == (void *)0x0)) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    while ((sVar2 = dictBufferCapacity, uVar3 < nbSamples &&
           (sVar2 = ZSTD_compress_usingCDict
                              (cctx,dst,sVar1,samples + offsets[uVar3],samplesSizes[uVar3],cdict),
           sVar2 < 0xffffffffffffff89))) {
      dictBufferCapacity = dictBufferCapacity + sVar2;
      uVar3 = uVar3 + 1;
    }
  }
  ZSTD_freeCCtx(cctx);
  ZSTD_freeCDict(cdict);
  free(dst);
  return sVar2;
}

Assistant:

size_t COVER_checkTotalCompressedSize(const ZDICT_cover_params_t parameters,
                                    const size_t *samplesSizes, const BYTE *samples,
                                    size_t *offsets,
                                    size_t nbTrainSamples, size_t nbSamples,
                                    BYTE *const dict, size_t dictBufferCapacity) {
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Pointers */
  ZSTD_CCtx *cctx;
  ZSTD_CDict *cdict;
  void *dst;
  /* Local variables */
  size_t dstCapacity;
  size_t i;
  /* Allocate dst with enough space to compress the maximum sized sample */
  {
    size_t maxSampleSize = 0;
    i = parameters.splitPoint < 1.0 ? nbTrainSamples : 0;
    for (; i < nbSamples; ++i) {
      maxSampleSize = MAX(samplesSizes[i], maxSampleSize);
    }
    dstCapacity = ZSTD_compressBound(maxSampleSize);
    dst = malloc(dstCapacity);
  }
  /* Create the cctx and cdict */
  cctx = ZSTD_createCCtx();
  cdict = ZSTD_createCDict(dict, dictBufferCapacity,
                           parameters.zParams.compressionLevel);
  if (!dst || !cctx || !cdict) {
    goto _compressCleanup;
  }
  /* Compress each sample and sum their sizes (or error) */
  totalCompressedSize = dictBufferCapacity;
  i = parameters.splitPoint < 1.0 ? nbTrainSamples : 0;
  for (; i < nbSamples; ++i) {
    const size_t size = ZSTD_compress_usingCDict(
        cctx, dst, dstCapacity, samples + offsets[i],
        samplesSizes[i], cdict);
    if (ZSTD_isError(size)) {
      totalCompressedSize = size;
      goto _compressCleanup;
    }
    totalCompressedSize += size;
  }
_compressCleanup:
  ZSTD_freeCCtx(cctx);
  ZSTD_freeCDict(cdict);
  if (dst) {
    free(dst);
  }
  return totalCompressedSize;
}